

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenModulePrintAsmjs(BinaryenModuleRef module)

{
  ostream *poVar1;
  Name funcName;
  undefined1 local_858 [8];
  Output out;
  Wasm2JSBuilder wasm2js;
  undefined1 local_138 [8];
  Flags flags;
  string local_108 [32];
  undefined1 local_e8 [40];
  undefined1 local_c0 [8];
  Wasm2JSGlue glue;
  JSPrinter jser;
  allocator<char> local_31;
  
  flags._0_8_ = &flags.symbolsFile._M_string_length;
  local_138[4] = false;
  local_138[0] = false;
  local_138[1] = false;
  local_138[2] = false;
  local_138[3] = false;
  flags.symbolsFile._M_dataplus._M_p = (pointer)0x0;
  flags.symbolsFile._M_string_length._0_1_ = 0;
  wasm::Wasm2JSBuilder::Flags::Flags
            ((Flags *)((long)&flags.symbolsFile.field_2 + 8),(Flags *)local_138);
  wasm::PassOptions::PassOptions
            ((PassOptions *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket,
             &globalPassOptions);
  wasm::Wasm2JSBuilder::Wasm2JSBuilder
            ((Wasm2JSBuilder *)&out.field_0x308,(Flags *)((long)&flags.symbolsFile.field_2 + 8),
             (PassOptions *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  wasm::PassOptions::~PassOptions
            ((PassOptions *)&wasm2js.functionsCallableFromOutside._M_h._M_single_bucket);
  std::__cxx11::string::~string(local_108);
  funcName.super_IString.str._M_str = DAT_00e645c0;
  funcName.super_IString.str._M_len = wasm::ASM_FUNC;
  jser._32_8_ = wasm::Wasm2JSBuilder::processWasm
                          ((Wasm2JSBuilder *)&out.field_0x308,module,funcName);
  glue.moduleName.super_IString.str._M_str._0_2_ = 0x101;
  jser.pretty = false;
  jser.finalize = false;
  jser._2_6_ = 0;
  jser.buffer._0_5_ = 0;
  jser.buffer._5_3_ = 0;
  jser.size._0_5_ = 0;
  jser._21_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"",&local_31);
  wasm::Output::Output((Output *)local_858,(string *)local_c0,Text);
  std::__cxx11::string::~string((string *)local_c0);
  wasm::Wasm2JSBuilder::Flags::Flags((Flags *)local_e8,(Flags *)local_138);
  wasm::Name::Name((Name *)&jser.ast,"asmFunc");
  local_c0 = (undefined1  [8])module;
  glue.wasm = (Module *)local_858;
  wasm::Wasm2JSBuilder::Flags::Flags((Flags *)&glue.out,(Flags *)local_e8);
  glue.flags.symbolsFile.field_2._8_8_ = jser.ast.inst;
  std::__cxx11::string::~string((string *)(local_e8 + 8));
  wasm::Wasm2JSGlue::emitPre((Wasm2JSGlue *)local_c0);
  cashew::JSPrinter::printAst((JSPrinter *)&glue.moduleName.super_IString.str._M_str);
  poVar1 = std::operator<<((ostream *)&std::cout,(char *)jser._0_8_);
  std::endl<char,std::char_traits<char>>(poVar1);
  wasm::Wasm2JSGlue::emitPost((Wasm2JSGlue *)local_c0);
  std::__cxx11::string::~string((string *)&glue.flags);
  wasm::Output::~Output((Output *)local_858);
  free((void *)jser._0_8_);
  wasm::Wasm2JSBuilder::~Wasm2JSBuilder((Wasm2JSBuilder *)&out.field_0x308);
  std::__cxx11::string::~string((string *)&flags);
  return;
}

Assistant:

void BinaryenModulePrintAsmjs(BinaryenModuleRef module) {
  auto* wasm = (Module*)module;
  Wasm2JSBuilder::Flags flags;
  Wasm2JSBuilder wasm2js(flags, globalPassOptions);
  auto asmjs = wasm2js.processWasm(wasm);
  JSPrinter jser(true, true, asmjs);
  Output out("", Flags::Text); // stdout
  Wasm2JSGlue glue(*wasm, out, flags, "asmFunc");
  glue.emitPre();
  jser.printAst();
  std::cout << jser.buffer << std::endl;
  glue.emitPost();
}